

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlSetMetaEncoding(htmlDocPtr doc,xmlChar *encoding)

{
  bool bVar1;
  int iVar2;
  xmlNodePtr elem;
  xmlChar *pxVar3;
  xmlChar *value;
  _xmlAttr *p_Stack_b0;
  int http;
  xmlAttrPtr attr;
  char newcontent [100];
  xmlChar *content;
  htmlNodePtr head;
  htmlNodePtr meta;
  htmlNodePtr cur;
  xmlChar *encoding_local;
  htmlDocPtr doc_local;
  
  head = (htmlNodePtr)0x0;
  content = (xmlChar *)0x0;
  stack0xffffffffffffffc0 = (xmlChar *)0x0;
  attr._0_1_ = 0;
  if (doc == (htmlDocPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else {
    iVar2 = xmlStrcasecmp(encoding,"html");
    if (iVar2 == 0) {
      doc_local._4_4_ = -1;
    }
    else {
      if (encoding != (xmlChar *)0x0) {
        snprintf((char *)&attr,100,"text/html; charset=%s",encoding);
        newcontent[0x5b] = '\0';
      }
      for (meta = doc->children; meta != (htmlNodePtr)0x0; meta = meta->next) {
        if ((meta->type == XML_ELEMENT_NODE) && (meta->name != (xmlChar *)0x0)) {
          iVar2 = xmlStrcasecmp(meta->name,"html");
          if (iVar2 == 0) break;
          iVar2 = xmlStrcasecmp(meta->name,"head");
          if (iVar2 == 0) goto LAB_00167643;
          iVar2 = xmlStrcasecmp(meta->name,(xmlChar *)"meta");
          if (iVar2 == 0) goto LAB_00167669;
        }
      }
      if (meta == (htmlNodePtr)0x0) {
        doc_local._4_4_ = -1;
      }
      else {
        for (meta = meta->children; meta != (htmlNodePtr)0x0; meta = meta->next) {
          if ((meta->type == XML_ELEMENT_NODE) && (meta->name != (xmlChar *)0x0)) {
            iVar2 = xmlStrcasecmp(meta->name,"head");
            if (iVar2 == 0) break;
            iVar2 = xmlStrcasecmp(meta->name,(xmlChar *)"meta");
            if (iVar2 == 0) {
              content = (xmlChar *)meta->parent;
              goto LAB_00167669;
            }
          }
        }
        if (meta == (htmlNodePtr)0x0) {
          doc_local._4_4_ = -1;
        }
        else {
LAB_00167643:
          content = (xmlChar *)meta;
          if (meta->children != (_xmlNode *)0x0) {
            meta = meta->children;
LAB_00167669:
            do {
              if (meta == (htmlNodePtr)0x0) break;
              if (((meta->type == XML_ELEMENT_NODE) && (meta->name != (xmlChar *)0x0)) &&
                 (iVar2 = xmlStrcasecmp(meta->name,(xmlChar *)"meta"), iVar2 == 0)) {
                p_Stack_b0 = meta->properties;
                stack0xffffffffffffffc0 = (xmlChar *)0x0;
                bVar1 = false;
                for (; p_Stack_b0 != (_xmlAttr *)0x0; p_Stack_b0 = p_Stack_b0->next) {
                  if (((p_Stack_b0->children != (_xmlNode *)0x0) &&
                      (p_Stack_b0->children->type == XML_TEXT_NODE)) &&
                     (p_Stack_b0->children->next == (_xmlNode *)0x0)) {
                    pxVar3 = p_Stack_b0->children->content;
                    iVar2 = xmlStrcasecmp(p_Stack_b0->name,(xmlChar *)"http-equiv");
                    if ((iVar2 == 0) &&
                       (iVar2 = xmlStrcasecmp(pxVar3,(xmlChar *)"Content-Type"), iVar2 == 0)) {
                      bVar1 = true;
                    }
                    else if ((pxVar3 != (xmlChar *)0x0) &&
                            (iVar2 = xmlStrcasecmp(p_Stack_b0->name,"content"), iVar2 == 0)) {
                      unique0x10000468 = pxVar3;
                    }
                    if ((bVar1) && (stack0xffffffffffffffc0 != (xmlChar *)0x0)) break;
                  }
                }
                if ((bVar1) && (stack0xffffffffffffffc0 != (xmlChar *)0x0)) {
                  head = meta;
                  break;
                }
              }
              meta = meta->next;
            } while( true );
          }
          if (head == (htmlNodePtr)0x0) {
            if ((encoding != (xmlChar *)0x0) && (content != (xmlChar *)0x0)) {
              elem = xmlNewDocNode(doc,(xmlNsPtr)0x0,(xmlChar *)"meta",(xmlChar *)0x0);
              if (*(long *)(content + 0x18) == 0) {
                xmlAddChild((xmlNodePtr)content,elem);
              }
              else {
                xmlAddPrevSibling(*(xmlNodePtr *)(content + 0x18),elem);
              }
              xmlNewProp(elem,(xmlChar *)"http-equiv",(xmlChar *)"Content-Type");
              xmlNewProp(elem,"content",(xmlChar *)&attr);
            }
          }
          else if (encoding == (xmlChar *)0x0) {
            xmlUnlinkNode(head);
            xmlFreeNode(head);
          }
          else {
            pxVar3 = xmlStrcasestr(stack0xffffffffffffffc0,encoding);
            if (pxVar3 == (xmlChar *)0x0) {
              xmlSetProp(head,"content",(xmlChar *)&attr);
            }
          }
          doc_local._4_4_ = 0;
        }
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
htmlSetMetaEncoding(htmlDocPtr doc, const xmlChar *encoding) {
    htmlNodePtr cur, meta = NULL, head = NULL;
    const xmlChar *content = NULL;
    char newcontent[100];

    newcontent[0] = 0;

    if (doc == NULL)
	return(-1);

    /* html isn't a real encoding it's just libxml2 way to get entities */
    if (!xmlStrcasecmp(encoding, BAD_CAST "html"))
        return(-1);

    if (encoding != NULL) {
	snprintf(newcontent, sizeof(newcontent), "text/html; charset=%s",
                (char *)encoding);
	newcontent[sizeof(newcontent) - 1] = 0;
    }

    cur = doc->children;

    /*
     * Search the html
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"html") == 0)
		break;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"head") == 0)
		goto found_head;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0)
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(-1);
    cur = cur->children;

    /*
     * Search the head
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"head") == 0)
		break;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0) {
                head = cur->parent;
		goto found_meta;
            }
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(-1);
found_head:
    head = cur;
    if (cur->children == NULL)
        goto create;
    cur = cur->children;

found_meta:
    /*
     * Search and update all the remaining the meta elements carrying
     * encoding information
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0) {
		xmlAttrPtr attr = cur->properties;
		int http;
		const xmlChar *value;

		content = NULL;
		http = 0;
		while (attr != NULL) {
		    if ((attr->children != NULL) &&
		        (attr->children->type == XML_TEXT_NODE) &&
		        (attr->children->next == NULL)) {
			value = attr->children->content;
			if ((!xmlStrcasecmp(attr->name, BAD_CAST"http-equiv"))
			 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
			    http = 1;
			else
                        {
                           if ((value != NULL) &&
                               (!xmlStrcasecmp(attr->name, BAD_CAST"content")))
			       content = value;
                        }
		        if ((http != 0) && (content != NULL))
			    break;
		    }
		    attr = attr->next;
		}
		if ((http != 0) && (content != NULL)) {
		    meta = cur;
		    break;
		}

	    }
	}
	cur = cur->next;
    }
create:
    if (meta == NULL) {
        if ((encoding != NULL) && (head != NULL)) {
            /*
             * Create a new Meta element with the right attributes
             */

            meta = xmlNewDocNode(doc, NULL, BAD_CAST"meta", NULL);
            if (head->children == NULL)
                xmlAddChild(head, meta);
            else
                xmlAddPrevSibling(head->children, meta);
            xmlNewProp(meta, BAD_CAST"http-equiv", BAD_CAST"Content-Type");
            xmlNewProp(meta, BAD_CAST"content", BAD_CAST newcontent);
        }
    } else {
        /* remove the meta tag if NULL is passed */
        if (encoding == NULL) {
            xmlUnlinkNode(meta);
            xmlFreeNode(meta);
        }
        /* change the document only if there is a real encoding change */
        else if (xmlStrcasestr(content, encoding) == NULL) {
            xmlSetProp(meta, BAD_CAST"content", BAD_CAST newcontent);
        }
    }


    return(0);
}